

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

int run_array_container_andnot(run_container_t *src_1,array_container_t *src_2,container_t **dst)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  rle16_t *prVar5;
  ushort *puVar6;
  rle16_t *prVar7;
  uint16_t *puVar8;
  uint16_t *puVar9;
  uint uVar10;
  _Bool _Var11;
  uint uVar12;
  run_container_t *prVar13;
  array_container_t *paVar14;
  bitset_container_t *src_1_00;
  run_container_t *prVar15;
  int32_t n_runs;
  long lVar16;
  ushort uVar17;
  int iVar18;
  long lVar19;
  uint uVar20;
  uint uVar21;
  int iVar22;
  int32_t iVar23;
  uint uVar24;
  int iVar25;
  int iVar26;
  uint8_t return_type;
  byte local_3d [13];
  
  lVar16 = cpuid_Extended_Feature_Enumeration_info(7);
  if ((*(uint *)(lVar16 + 4) & 0x20) == 0) {
    uVar12 = src_1->n_runs;
    lVar16 = (long)(int)uVar12;
    if (lVar16 < 1) goto LAB_0010c8a8;
    lVar19 = 0;
    do {
      uVar12 = uVar12 + src_1->runs[lVar19].length;
      lVar19 = lVar19 + 1;
    } while (lVar16 != lVar19);
  }
  else {
    uVar12 = _avx2_run_container_cardinality(src_1);
  }
  if (0x20 < (int)uVar12) {
    if (0x1000 < uVar12) {
      src_1_00 = bitset_container_from_run(src_1);
      _Var11 = bitset_array_container_iandnot(src_1_00,src_2,dst);
      return 2 - (uint)_Var11;
    }
    paVar14 = array_container_create_given_capacity(uVar12);
    iVar3 = src_1->n_runs;
    if ((long)iVar3 < 1) {
      iVar23 = 0;
    }
    else {
      prVar5 = src_1->runs;
      puVar8 = src_2->array;
      iVar4 = src_2->cardinality;
      iVar22 = -1;
      lVar16 = 0;
      iVar23 = 0;
      do {
        uVar17 = prVar5[lVar16].value;
        uVar12 = (uint)uVar17;
        uVar1 = prVar5[lVar16].length;
        iVar25 = iVar22 + 1;
        iVar26 = iVar25;
        if ((iVar25 < iVar4) && (puVar8[iVar25] < uVar17)) {
          iVar26 = iVar22 + 2;
          iVar18 = 1;
          if (iVar26 < iVar4) {
            iVar18 = 1;
            do {
              uVar2 = puVar8[iVar26];
              if (uVar17 <= uVar2) goto LAB_0010ca2f;
              iVar22 = iVar18 * 2;
              iVar26 = iVar25 + iVar18 * 2;
              iVar18 = iVar22;
            } while (iVar26 < iVar4);
          }
          uVar2 = puVar8[(long)iVar4 + -1];
          iVar26 = iVar4 + -1;
LAB_0010ca2f:
          if (uVar2 == uVar17) goto LAB_0010ca3c;
          iVar22 = iVar4;
          if (uVar17 <= uVar2) {
            if (iVar25 + (iVar18 >> 1) + 1 != iVar26) {
              iVar25 = (iVar18 >> 1) + iVar25;
              iVar22 = iVar26;
              do {
                iVar26 = iVar25 + iVar22 >> 1;
                if (puVar8[iVar26] == uVar17) break;
                iVar18 = iVar26;
                if (puVar8[iVar26] < uVar17) {
                  iVar18 = iVar22;
                  iVar25 = iVar26;
                }
                iVar26 = iVar18;
                iVar22 = iVar26;
              } while (iVar25 + 1 != iVar26);
            }
            goto LAB_0010ca3c;
          }
LAB_0010ca7e:
          puVar9 = paVar14->array;
          lVar19 = 0;
          do {
            puVar9[iVar23 + lVar19] = uVar17 + (short)lVar19;
            lVar19 = lVar19 + 1;
          } while (uVar1 + 1 != (int)lVar19);
          iVar23 = iVar23 + (int)lVar19;
        }
        else {
LAB_0010ca3c:
          iVar22 = iVar26;
          if (iVar4 <= iVar26) goto LAB_0010ca7e;
          uVar20 = (uint)puVar8[iVar26];
          if ((uint)uVar1 + (uint)uVar17 < (uint)puVar8[iVar26]) {
            puVar9 = paVar14->array;
            lVar19 = 0;
            do {
              puVar9[iVar23 + lVar19] = uVar17 + (short)lVar19;
              lVar19 = lVar19 + 1;
            } while (uVar1 + 1 != (int)lVar19);
            iVar23 = iVar23 + (int)lVar19;
          }
          else {
            iVar22 = uVar1 + 1;
            do {
              if (uVar12 == uVar20) {
                iVar25 = iVar26 + 1;
                if (iVar25 < iVar4) {
                  uVar20 = (uint)puVar8[iVar25];
                  iVar26 = iVar25;
                }
                else {
                  uVar20 = 0;
                }
              }
              else {
                lVar19 = (long)iVar23;
                iVar23 = iVar23 + 1;
                paVar14->array[lVar19] = (uint16_t)uVar12;
              }
              uVar12 = uVar12 + 1;
              iVar22 = iVar22 + -1;
            } while (iVar22 != 0);
          }
          iVar22 = iVar26 + -1;
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 != iVar3);
    }
    paVar14->cardinality = iVar23;
    *dst = paVar14;
    return 2;
  }
LAB_0010c8a8:
  if (src_2->cardinality == 0) {
    prVar13 = run_container_clone(src_1);
    *dst = prVar13;
    uVar12 = 3;
  }
  else {
    prVar13 = run_container_create_given_capacity(src_2->cardinality + uVar12);
    iVar3 = src_1->n_runs;
    if (0 < iVar3) {
      prVar5 = src_1->runs;
      puVar6 = src_2->array;
      uVar20 = (uint)*puVar6;
      uVar12 = (uint)prVar5->value;
      uVar21 = (uint)prVar5->length + (uint)prVar5->value + 1;
      iVar4 = src_2->cardinality;
      uVar24 = 0;
      iVar22 = 0;
      do {
        uVar17 = (ushort)uVar12;
        if (iVar4 <= iVar22) {
          prVar7 = prVar13->runs;
          lVar16 = (long)prVar13->n_runs;
          iVar22 = (int)(lVar16 + 1);
          prVar13->n_runs = iVar22;
          prVar7[lVar16].value = uVar17;
          prVar7[lVar16].length = (short)uVar21 + ~uVar17;
          iVar4 = uVar24 + 1;
          if (iVar3 - iVar4 != 0 && iVar4 <= iVar3) {
            memcpy(prVar7 + lVar16 + 1,prVar5 + iVar4,(long)(iVar3 - iVar4) << 2);
            prVar13->n_runs = ~uVar24 + src_1->n_runs + iVar22;
          }
          break;
        }
        uVar10 = uVar12;
        if (uVar20 < uVar21) {
          if (uVar20 < uVar12) {
            iVar22 = iVar22 + 1;
            if (iVar22 < iVar4) {
              uVar20 = (uint)puVar6[iVar22];
            }
          }
          else {
            if (uVar12 < uVar20) {
              prVar7 = prVar13->runs;
              iVar26 = prVar13->n_runs;
              prVar13->n_runs = iVar26 + 1;
              prVar7[iVar26].value = uVar17;
              prVar7[iVar26].length = ~uVar17 + (short)uVar20;
            }
            uVar10 = uVar20 + 1;
            if (uVar21 <= uVar20 + 1) goto LAB_0010c92f;
          }
        }
        else {
          prVar7 = prVar13->runs;
          iVar26 = prVar13->n_runs;
          prVar13->n_runs = iVar26 + 1;
          prVar7[iVar26].value = uVar17;
          prVar7[iVar26].length = ~uVar17 + (short)uVar21;
LAB_0010c92f:
          uVar24 = uVar24 + 1;
          uVar10 = uVar12;
          if ((int)uVar24 < iVar3) {
            uVar21 = (uint)prVar5[(int)uVar24].length + (uint)prVar5[(int)uVar24].value + 1;
            uVar10 = (uint)prVar5[(int)uVar24].value;
          }
        }
        uVar12 = uVar10;
      } while ((int)uVar24 < iVar3);
    }
    prVar15 = (run_container_t *)convert_run_to_efficient_container(prVar13,local_3d);
    *dst = prVar15;
    if (prVar13 != prVar15) {
      run_container_free(prVar13);
    }
    uVar12 = (uint)local_3d[0];
  }
  return uVar12;
}

Assistant:

int run_array_container_andnot(
    const run_container_t *src_1, const array_container_t *src_2,
    container_t **dst
){
    // follows the Java impl as of June 2016

    int card = run_container_cardinality(src_1);
    const int arbitrary_threshold = 32;

    if (card <= arbitrary_threshold) {
        if (src_2->cardinality == 0) {
            *dst = run_container_clone(src_1);
            return RUN_CONTAINER_TYPE;
        }
        // Java's "lazyandNot.toEfficientContainer" thing
        run_container_t *answer = run_container_create_given_capacity(
            card + array_container_cardinality(src_2));

        int rlepos = 0;
        int xrlepos = 0;  // "x" is src_2
        rle16_t rle = src_1->runs[rlepos];
        int32_t start = rle.value;
        int32_t end = start + rle.length + 1;
        int32_t xstart = src_2->array[xrlepos];

        while ((rlepos < src_1->n_runs) && (xrlepos < src_2->cardinality)) {
            if (end <= xstart) {
                // output the first run
                answer->runs[answer->n_runs++] =
                    MAKE_RLE16(start, end - start - 1);
                rlepos++;
                if (rlepos < src_1->n_runs) {
                    start = src_1->runs[rlepos].value;
                    end = start + src_1->runs[rlepos].length + 1;
                }
            } else if (xstart + 1 <= start) {
                // exit the second run
                xrlepos++;
                if (xrlepos < src_2->cardinality) {
                    xstart = src_2->array[xrlepos];
                }
            } else {
                if (start < xstart) {
                    answer->runs[answer->n_runs++] =
                        MAKE_RLE16(start, xstart - start - 1);
                }
                if (xstart + 1 < end) {
                    start = xstart + 1;
                } else {
                    rlepos++;
                    if (rlepos < src_1->n_runs) {
                        start = src_1->runs[rlepos].value;
                        end = start + src_1->runs[rlepos].length + 1;
                    }
                }
            }
        }
        if (rlepos < src_1->n_runs) {
            answer->runs[answer->n_runs++] = MAKE_RLE16(start, end - start - 1);
            rlepos++;
            if (rlepos < src_1->n_runs) {
                memcpy(answer->runs + answer->n_runs, src_1->runs + rlepos,
                       (src_1->n_runs - rlepos) * sizeof(rle16_t));
                answer->n_runs += (src_1->n_runs - rlepos);
            }
        }
        uint8_t return_type;
        *dst = convert_run_to_efficient_container(answer, &return_type);
        if (answer != *dst) run_container_free(answer);
        return return_type;
    }
    // else it's a bitmap or array

    if (card <= DEFAULT_MAX_SIZE) {
        array_container_t *ac = array_container_create_given_capacity(card);
        // nb Java code used a generic iterator-based merge to compute
        // difference
        ac->cardinality = run_array_array_subtract(src_1, src_2, ac);
        *dst = ac;
        return ARRAY_CONTAINER_TYPE;
    }
    bitset_container_t *ans = bitset_container_from_run(src_1);
    bool result_is_bitset = bitset_array_container_iandnot(ans, src_2, dst);
    return (result_is_bitset ? BITSET_CONTAINER_TYPE
                             : ARRAY_CONTAINER_TYPE);
}